

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_no_mac.c
# Opt level: O2

int32_t ll_rssi_scan_get(uint8_t *buf,uint16_t len,uint8_t *bytes_received)

{
  int32_t iVar1;
  int32_t iVar2;
  undefined6 in_register_00000032;
  
  if (bytes_received == (uint8_t *)0x0 ||
      ((int)CONCAT62(in_register_00000032,len) == 0 || buf == (uint8_t *)0x0)) {
    iVar1 = -0x65;
  }
  else {
    iVar1 = hal_read_write(OP_RSSI_GET,(uint8_t *)0x0,0,buf,len);
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    if (-1 < iVar1) {
      iVar1 = 0;
    }
    *bytes_received = (uint8_t)iVar2;
  }
  return iVar1;
}

Assistant:

int32_t ll_rssi_scan_get(uint8_t buf[], uint16_t len, uint8_t *bytes_received)
{
    int32_t rw_response;

    if (buf == NULL || len <= 0 || bytes_received == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    rw_response = hal_read_write(OP_RSSI_GET, NULL, 0, buf, len);

    if (rw_response < 0)
    {
        *bytes_received = 0;
        return rw_response;
    }

    *bytes_received = (uint8_t) (rw_response & 0xFF);
    return (rw_response >= 0) ? LL_IFC_ACK : rw_response;
}